

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

int get_branchlength(uint32_t **pptrptr,int *errcodeptr,int *lcptr,parsed_recurse_check *recurses,
                    compile_block_16 *cb)

{
  int iVar1;
  BOOL BVar2;
  int iVar3;
  parsed_recurse_check *ppVar4;
  uint32_t *puVar5;
  uint uVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  uint16_t *puVar12;
  PCRE2_SPTR16 str1;
  uint32_t uVar13;
  uint uVar14;
  uint *local_80;
  compile_block_16 *local_78;
  parsed_recurse_check *local_70;
  size_t local_68;
  int *local_60;
  int *local_58;
  uint32_t **local_50;
  uint *local_48;
  parsed_recurse_check this_recurse;
  
  puVar5 = *pptrptr;
  iVar1 = *lcptr;
  *lcptr = iVar1 + 1;
  if (2000 < iVar1) {
    *errcodeptr = 0x87;
    return -1;
  }
  iVar1 = 0;
  iVar10 = 0;
  local_78 = cb;
  local_70 = recurses;
  local_58 = lcptr;
LAB_00128605:
  uVar6 = *puVar5;
  local_80 = puVar5;
  if (-1 < (int)uVar6) goto switchD_00128657_caseD_b;
  uVar14 = 0;
  iVar3 = 0;
  switch(uVar6 + 0x7fff0000 >> 0x10) {
  case 0:
  case 0x18:
    goto switchD_00128657_caseD_0;
  case 1:
  case 0x19:
    goto switchD_00128657_caseD_1;
  case 2:
    if (((cb->external_options & 0x200) != 0) || ((cb->external_flags & 0x200000) != 0))
    goto switchD_00128657_caseD_a;
    uVar13 = uVar6 & 0xffff;
    if (9 < uVar13) goto LAB_0012887b;
    sVar7 = cb->small_ref_offset[uVar13];
    goto LAB_00128891;
  case 3:
    if ((cb->external_options & 0x200) != 0) goto switchD_00128657_caseD_a;
  case 0x20:
    uVar14 = puVar5[1];
    local_80 = puVar5 + 3;
    local_68 = CONCAT44(puVar5[2],puVar5[3]);
    str1 = cb->start_pattern + local_68;
    puVar12 = &cb->named_groups->isdup;
    uVar9 = 0;
    local_60 = errcodeptr;
    local_50 = pptrptr;
    while( true ) {
      if (cb->names_found <= uVar9) goto LAB_00128a3c;
      if ((uVar14 == puVar12[-1]) &&
         (iVar1 = _pcre2_strncmp_16(str1,((named_group_16 *)(puVar12 + -7))->name,(ulong)uVar14),
         cb = local_78, iVar1 == 0)) break;
      uVar9 = uVar9 + 1;
      puVar12 = puVar12 + 8;
    }
    uVar13 = *(uint32_t *)(puVar12 + -3);
    if (uVar13 == 0) {
LAB_00128a3c:
      *local_60 = 0x73;
      cb->erroroffset = local_68;
      return -1;
    }
    sVar7 = local_68;
    errcodeptr = local_60;
    pptrptr = local_50;
    if (((uVar6 & 0xffff0000) != 0x80210000) &&
       ((*puVar12 != 0 || ((local_78->external_flags & 0x200000) != 0))))
    goto switchD_00128657_caseD_a;
LAB_00128891:
    if (cb->bracount < uVar13) {
      cb->erroroffset = sVar7;
      *errcodeptr = 0x73;
      return -1;
    }
    if (uVar13 != 0) {
      puVar11 = cb->parsed_pattern;
      do {
        if ((*puVar11 & 0xffff0000) == 0x80050000) {
          puVar11 = puVar11 + 1;
        }
        else if (*puVar11 == (uVar13 | 0x80080000)) goto LAB_001288e0;
        puVar11 = puVar11 + 1;
      } while( true );
    }
    goto switchD_00128657_caseD_a;
  case 4:
switchD_00128657_caseD_4:
    local_80 = puVar5 + 1;
  case 0xb:
  case 0x16:
switchD_00128657_caseD_b:
    iVar3 = 1;
    break;
  case 5:
    local_80 = puVar5 + 3;
    iVar3 = 0;
    break;
  case 6:
    local_80 = puVar5 + 5;
    break;
  case 7:
    uVar14 = uVar6 & 0xffff;
    goto switchD_00128657_caseD_1;
  case 8:
  case 0x15:
  case 0x28:
  case 0x2a:
  case 0x2c:
  case 0x2e:
    break;
  case 9:
  case 0xd:
    local_80 = parsed_skip(puVar5,1);
    cb = local_78;
    iVar3 = 1;
    if (local_80 == (uint32_t *)0x0) goto LAB_00128a8e;
    break;
  default:
    goto switchD_00128657_caseD_a;
  case 0xe:
    local_80 = puVar5 + 1;
    goto LAB_0012865d;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    local_80 = puVar5 + 4;
LAB_0012865d:
    uVar14 = 0;
    goto LAB_0012898e;
  case 0x17:
    if ((short)uVar6 == 0x11) {
      return -1;
    }
    uVar6 = uVar6 & 0xffff;
    if (uVar6 == 0x16) {
      return -1;
    }
    if (uVar6 - 6 < 0x11) {
      if ((uVar6 == 0xe) && ((cb->external_options & 0x80000) != 0)) {
        *errcodeptr = 0x88;
        return -1;
      }
      if (uVar6 - 0xf < 2) goto switchD_00128657_caseD_4;
      goto switchD_00128657_caseD_b;
    }
    break;
  case 0x1a:
    local_80 = puVar5 + 1;
    break;
  case 0x1f:
LAB_0012887b:
    uVar13 = uVar6 & 0xffff;
    sVar7 = CONCAT44(puVar5[1],puVar5[2]);
    local_80 = puVar5 + 2;
    goto LAB_00128891;
  case 0x21:
  case 0x22:
    local_80 = parsed_skip(puVar5 + 1,2);
    if (local_80 == (uint32_t *)0x0) goto LAB_00128a8e;
    uVar6 = local_80[1] << 0x10 | local_80[1] + 0x7fcf0000 >> 0x10;
    cb = local_78;
    if (uVar6 < 9) {
      local_80 = local_80 + 1;
    }
    else if (uVar6 - 9 < 3) {
      local_80 = local_80 + 3;
    }
    break;
  case 0x23:
  case 0x24:
    BVar2 = set_lookbehind_lengths(&local_80,errcodeptr,local_58,local_70,local_78);
    cb = local_78;
    if (BVar2 == 0) {
      return -1;
    }
    break;
  case 0x25:
  case 0x29:
  case 0x2b:
  case 0x2d:
  case 0x2f:
    local_80 = puVar5 + (puVar5[1] + 1);
    break;
  case 0x26:
  case 0x27:
    puVar5 = parsed_skip(puVar5,0);
    cb = local_78;
    if (puVar5 == (uint32_t *)0x0) goto LAB_00128a8e;
switchD_00128657_caseD_0:
    *pptrptr = puVar5;
    if (cb->max_lookbehind < iVar10) {
      cb->max_lookbehind = iVar10;
      return iVar10;
    }
    return iVar10;
  case 0x39:
  case 0x3a:
  case 0x3b:
    uVar13 = puVar5[1];
    if (uVar13 != puVar5[2]) goto switchD_00128657_caseD_a;
    local_80 = puVar5 + 2;
    iVar8 = 0;
    if (uVar13 == 0) {
      iVar8 = iVar1;
    }
    iVar3 = (uVar13 - 1) * iVar1;
    if (uVar13 == 0) {
      iVar3 = 0;
    }
    iVar10 = iVar10 - iVar8;
  }
  goto switchD_00128657_caseD_8;
switchD_00128657_caseD_1:
  local_80 = puVar5 + 1;
LAB_0012898e:
  iVar3 = get_grouplength(&local_80,1,errcodeptr,local_58,uVar14,local_70,cb);
  cb = local_78;
  if (iVar3 < 0) {
    return -1;
  }
switchD_00128657_caseD_8:
  iVar1 = iVar3;
  iVar10 = iVar10 + iVar1;
  if (0xffff < iVar10) {
    *errcodeptr = 0xbb;
    return -1;
  }
  puVar5 = local_80 + 1;
  goto LAB_00128605;
LAB_001288e0:
  local_48 = puVar11;
  puVar5 = parsed_skip(puVar11 + 1,2);
  if (puVar5 == (uint32_t *)0x0) {
LAB_00128a8e:
    *errcodeptr = 0xbe;
    return -1;
  }
  ppVar4 = local_70;
  if (local_80 <= puVar11 || puVar5 <= local_80) {
    for (; ppVar4 != (parsed_recurse_check *)0x0; ppVar4 = ppVar4->prev) {
      if (ppVar4->groupptr == puVar11) goto switchD_00128657_caseD_a;
    }
    this_recurse.prev = local_70;
    local_48 = puVar11 + 1;
    this_recurse.groupptr = puVar11;
    iVar3 = get_grouplength(&local_48,0,errcodeptr,local_58,uVar13,&this_recurse,local_78);
    cb = local_78;
    if (-1 < iVar3) goto switchD_00128657_caseD_8;
    if (*errcodeptr != 0) {
      return -1;
    }
  }
switchD_00128657_caseD_a:
  *errcodeptr = 0x7d;
  return -1;
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int grouplength;
uint32_t lastitemlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;

  if (*pptr < META_END)
    {
    itemlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 1;
    break;

    case META_BIGVALUE:
    itemlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R and \X are never
    allowed because they might match more than character. \C is allowed only in
    32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_R || escape == ESC_X) return -1;
    if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads can be ignored, but we must start the skip inside the group
    so that it isn't treated as a group within the branch. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;

    /* Also ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* Lookbehinds can be ignored, but must themselves be checked. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, FALSE, errcodeptr, lcptr, group,
      &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    break;

    /* Check nested groups - advance past the initial data for each type and
    then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_DEFINE:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, TRUE, errcodeptr, lcptr, group,
      recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    break;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    if (pptr[1] == pptr[2])
      {
      if (pptr[1] == 0) branchlength -= lastitemlength;
        else itemlength = (pptr[1] - 1) * lastitemlength;
      pptr += 2;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, and save it for use if the next
  thing is a quantifier. */

  branchlength += itemlength;
  lastitemlength = itemlength;

  /* Ensure that the length does not overflow the limit. */

  if (branchlength > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }
  }

EXIT:
*pptrptr = pptr;
if (branchlength > cb->max_lookbehind) cb->max_lookbehind = branchlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}